

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

btScalar __thiscall
btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact
          (btSoftBodyConcaveCollisionAlgorithm *this,btCollisionObject *body0,
          btCollisionObject *body1,btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  btCollisionObject *pbVar4;
  btScalar bVar5;
  undefined1 auVar6 [16];
  btTransform convexToLocal;
  btTransform convexFromLocal;
  btTransform triInv;
  btTransform local_1c0;
  btTransform local_180;
  btVector3 local_140;
  btScalar abStack_130 [2];
  btScalar local_128 [2];
  btScalar abStack_120 [2];
  btScalar local_118 [2];
  btScalar abStack_110 [2];
  ulong local_108;
  btScalar abStack_100 [2];
  btScalar local_f8 [2];
  btScalar abStack_f0 [2];
  btScalar local_e8 [2];
  btScalar abStack_e0 [2];
  btScalar local_d8 [2];
  btScalar abStack_d0 [2];
  btScalar local_c8;
  btScalar bStack_c4;
  btScalar bStack_c0;
  btScalar bStack_bc;
  btScalar local_78;
  float local_74;
  btTransform local_70;
  
  bVar1 = this->m_isSwapped;
  pbVar4 = body0;
  if (bVar1 != false) {
    pbVar4 = body1;
  }
  local_140 = operator-(&(pbVar4->m_interpolationWorldTransform).m_origin,
                        &(pbVar4->m_worldTransform).m_origin);
  bVar5 = btVector3::length2(&local_140);
  if (pbVar4->m_ccdMotionThreshold * pbVar4->m_ccdMotionThreshold <= bVar5) {
    if (bVar1 != false) {
      body1 = body0;
    }
    btTransform::inverse(&local_70,&body1->m_worldTransform);
    btTransform::operator*(&local_180,&local_70,&pbVar4->m_worldTransform);
    btTransform::operator*(&local_1c0,&local_70,&pbVar4->m_interpolationWorldTransform);
    if (8 < body1->m_collisionShape->m_shapeType - 0x15U) {
      return 1.0;
    }
    auVar6._4_4_ = local_1c0.m_origin.m_floats[1];
    auVar6._0_4_ = local_1c0.m_origin.m_floats[0];
    auVar6._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_4_ = local_180.m_origin.m_floats[0];
    auVar2._4_4_ = local_180.m_origin.m_floats[1];
    maxps(auVar6,auVar2);
    local_78 = pbVar4->m_ccdSweptSphereRadius;
    local_140.m_floats[2] = local_180.m_basis.m_el[0].m_floats[0];
    local_140.m_floats[3] = local_180.m_basis.m_el[0].m_floats[1];
    local_140.m_floats._0_8_ = &PTR__btTriangleCallback_001f2908;
    abStack_130[0] = local_180.m_basis.m_el[0].m_floats[2];
    abStack_130[1] = local_180.m_basis.m_el[0].m_floats[3];
    local_128[0] = local_180.m_basis.m_el[1].m_floats[0];
    local_128[1] = local_180.m_basis.m_el[1].m_floats[1];
    abStack_120[0] = local_180.m_basis.m_el[1].m_floats[2];
    abStack_120[1] = local_180.m_basis.m_el[1].m_floats[3];
    local_118[0] = local_180.m_basis.m_el[2].m_floats[0];
    local_118[1] = local_180.m_basis.m_el[2].m_floats[1];
    abStack_110[0] = local_180.m_basis.m_el[2].m_floats[2];
    abStack_110[1] = local_180.m_basis.m_el[2].m_floats[3];
    local_108._0_4_ = local_180.m_origin.m_floats[0];
    local_108._4_4_ = local_180.m_origin.m_floats[1];
    abStack_100[0] = local_180.m_origin.m_floats[2];
    abStack_100[1] = local_180.m_origin.m_floats[3];
    local_f8[0] = local_1c0.m_basis.m_el[0].m_floats[0];
    local_f8[1] = local_1c0.m_basis.m_el[0].m_floats[1];
    abStack_f0[0] = local_1c0.m_basis.m_el[0].m_floats[2];
    abStack_f0[1] = local_1c0.m_basis.m_el[0].m_floats[3];
    local_e8[0] = local_1c0.m_basis.m_el[1].m_floats[0];
    local_e8[1] = local_1c0.m_basis.m_el[1].m_floats[1];
    abStack_e0[0] = local_1c0.m_basis.m_el[1].m_floats[2];
    abStack_e0[1] = local_1c0.m_basis.m_el[1].m_floats[3];
    local_d8[0] = local_1c0.m_basis.m_el[2].m_floats[0];
    local_d8[1] = local_1c0.m_basis.m_el[2].m_floats[1];
    abStack_d0[0] = local_1c0.m_basis.m_el[2].m_floats[2];
    abStack_d0[1] = local_1c0.m_basis.m_el[2].m_floats[3];
    local_c8 = local_1c0.m_origin.m_floats[0];
    bStack_c4 = local_1c0.m_origin.m_floats[1];
    bStack_c0 = local_1c0.m_origin.m_floats[2];
    bStack_bc = local_1c0.m_origin.m_floats[3];
    local_74 = pbVar4->m_hitFraction;
    (*body1->m_collisionShape->_vptr_btCollisionShape[0x10])();
    fVar3 = local_74;
    if (local_74 < pbVar4->m_hitFraction) {
      pbVar4->m_hitFraction = local_74;
      btTriangleCallback::~btTriangleCallback((btTriangleCallback *)&local_140);
      return fVar3;
    }
    btTriangleCallback::~btTriangleCallback((btTriangleCallback *)&local_140);
  }
  return 1.0;
}

Assistant:

btScalar btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	btCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	btCollisionObject* triBody = m_isSwapped ? body0 : body1;


	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the btConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	btScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return btScalar(1.);
	}

	//const btVector3& from = convexbody->m_worldTransform.getOrigin();
	//btVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	btTransform triInv = triBody->getWorldTransform().inverse();
	btTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	btTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback	: public btTriangleCallback
	{
		btTransform m_ccdSphereFromTrans;
		btTransform m_ccdSphereToTrans;
		btTransform	m_meshTransform;

		btScalar	m_ccdSphereRadius;
		btScalar	m_hitFraction;


		LocalTriangleSphereCastCallback(const btTransform& from,const btTransform& to,btScalar ccdSphereRadius,btScalar hitFraction)
			:m_ccdSphereFromTrans(from),
			m_ccdSphereToTrans(to),
			m_ccdSphereRadius(ccdSphereRadius),
			m_hitFraction(hitFraction)
		{			
		}


		virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}

	};





	if (triBody->getCollisionShape()->isConcave())
	{
		btVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		btVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		btScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= btVector3(ccdRadius0,ccdRadius0,ccdRadius0);
		rayAabbMax += btVector3(ccdRadius0,ccdRadius0,ccdRadius0);

		btScalar curHitFraction = btScalar(1.); //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal,convexToLocal,
			convexbody->getCcdSweptSphereRadius(),curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		btCollisionObject* concavebody = triBody;

		btConcaveShape* triangleMesh = (btConcaveShape*) concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback,rayAabbMin,rayAabbMax);
		}



		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction( raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return btScalar(1.);

}